

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

void __thiscall
jaegertracing::agent::thrift::AgentConcurrentClient::send_emitZipkinBatch
          (AgentConcurrentClient *this,
          vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
          *spans)

{
  TProtocol *pTVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Agent_emitZipkinBatch_pargs args;
  TConcurrentSendSentry sentry;
  Agent_emitZipkinBatch_pargs local_50;
  _func_int *local_40 [2];
  TConcurrentSendSentry local_30;
  
  apache::thrift::async::TConcurrentSendSentry::TConcurrentSendSentry(&local_30,&this->sync_);
  pTVar1 = this->oprot_;
  local_50._vptr_Agent_emitZipkinBatch_pargs = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"emitZipkinBatch","");
  __n = 0;
  (*pTVar1->_vptr_TProtocol[2])(pTVar1,&local_50,4);
  __buf = extraout_RDX;
  if (local_50._vptr_Agent_emitZipkinBatch_pargs != local_40) {
    operator_delete(local_50._vptr_Agent_emitZipkinBatch_pargs);
    __buf = extraout_RDX_00;
  }
  local_50._vptr_Agent_emitZipkinBatch_pargs =
       (_func_int **)&PTR__Agent_emitZipkinBatch_pargs_00266670;
  local_50.spans = spans;
  Agent_emitZipkinBatch_pargs::write(&local_50,(int)this->oprot_,__buf,__n);
  (*this->oprot_->_vptr_TProtocol[3])();
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[10])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar2 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (this->oprot_->ptrans_).
           super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar2->_vptr_TTransport[0xb])();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  apache::thrift::async::TConcurrentSendSentry::commit(&local_30);
  Agent_emitZipkinBatch_pargs::~Agent_emitZipkinBatch_pargs(&local_50);
  apache::thrift::async::TConcurrentSendSentry::~TConcurrentSendSentry(&local_30);
  return;
}

Assistant:

void AgentConcurrentClient::send_emitZipkinBatch(const std::vector< ::twitter::zipkin::thrift::Span> & spans)
{
  int32_t cseqid = 0;
  ::apache::thrift::async::TConcurrentSendSentry sentry(&this->sync_);
  oprot_->writeMessageBegin("emitZipkinBatch", ::apache::thrift::protocol::T_ONEWAY, cseqid);

  Agent_emitZipkinBatch_pargs args;
  args.spans = &spans;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();

  sentry.commit();
}